

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf.c
# Opt level: O0

void do_inproc_thr(int argc,char **argv)

{
  undefined8 uVar1;
  long lVar2;
  char *local_58;
  char *addr;
  char *arg;
  int local_40;
  int val;
  int optidx;
  int rv;
  inproc_args ia;
  nng_thread *thr;
  char **argv_local;
  int argc_local;
  
  local_58 = "inproc://throughput-test";
  local_40 = 0;
  while (val = nng_args_parse(argc,argv,opts,(int *)((long)&arg + 4),&addr,&local_40), val == 0) {
    switch(arg._4_4_) {
    case 1:
      open_client = nng_pair0_open;
      open_server = nng_pair0_open;
      break;
    case 2:
      open_client = nng_pair1_open;
      open_server = nng_pair1_open;
      break;
    default:
      die("bad option");
      break;
    case 5:
      open_client = nng_pull0_open;
      open_server = nng_push0_open;
      break;
    case 8:
      local_58 = addr;
    }
  }
  lVar2 = (long)local_40;
  if (argc - local_40 != 2) {
    die("Usage: inproc_thr <msg-size> <count>");
  }
  ia._0_8_ = local_58;
  rv = parse_int(argv[lVar2],"message size");
  optidx = parse_int((argv + lVar2)[1],"count");
  ia.addr = (char *)throughput_server;
  val = nng_thread_create(&ia.func,do_inproc,&optidx);
  if (val != 0) {
    uVar1 = nng_strerror(val);
    die("Cannot create thread: %s",uVar1);
  }
  nng_msleep(100);
  throughput_client(local_58,(long)rv,optidx);
  nng_thread_destroy(ia.func);
  return;
}

Assistant:

void
do_inproc_thr(int argc, char **argv)
{
	nng_thread        *thr;
	struct inproc_args ia;
	int                rv;
	int                optidx;
	int                val;
	char              *arg;
	char              *addr = "inproc://throughput-test";

	optidx = 0;
	while ((rv = nng_args_parse(argc, argv, opts, &val, &arg, &optidx)) ==
	    0) {
		switch (val) {
#if 0
		// For now these protocols simply do not work with
		// throughput -- they don't work with backpressure properly.
		// In the future we should support synchronizing in the same
		// process, and alerting the sender both on completion of
		// a single message, and on completion of all messages.
		case OPT_REQREP0:
			open_client = nng_req0_open;
			open_server = nng_rep0_open;
			break;
#endif
		case OPT_PAIR0:
			open_client = nng_pair0_open;
			open_server = nng_pair0_open;
			break;
		case OPT_PAIR1:
			open_client = nng_pair1_open;
			open_server = nng_pair1_open;
			break;
		case OPT_PIPELINE0:
			open_client = nng_pull0_open;
			open_server = nng_push0_open;
			break;
		case OPT_URL:
			addr = arg;
			break;
		default:
			die("bad option");
		}
	}
	argc -= optidx;
	argv += optidx;

	if (argc != 2) {
		die("Usage: inproc_thr <msg-size> <count>");
	}

	ia.addr    = addr;
	ia.msgsize = parse_int(argv[0], "message size");
	ia.count   = parse_int(argv[1], "count");
	ia.func    = throughput_server;

	if ((rv = nng_thread_create(&thr, do_inproc, &ia)) != 0) {
		die("Cannot create thread: %s", nng_strerror(rv));
	}

	// Sleep a bit.
	nng_msleep(100);

	throughput_client(addr, ia.msgsize, ia.count);
	nng_thread_destroy(thr);
}